

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O0

wchar_t average_spell_stat(player *p,player_state_conflict *state)

{
  magic_realm *pmVar1;
  magic_realm *r_next;
  magic_realm *realm;
  wchar_t local_20;
  wchar_t sum;
  wchar_t count;
  wchar_t i;
  player_state_conflict *state_local;
  player *p_local;
  
  realm._4_4_ = 0;
  _count = state;
  state_local = (player_state_conflict *)p;
  r_next = class_magic_realms(p->class,&local_20);
  for (sum = local_20; L'\0' < sum; sum = sum + L'\xffffffff') {
    realm._4_4_ = _count->stat_ind[r_next->stat] + realm._4_4_;
    pmVar1 = r_next->next;
    mem_free(r_next);
    r_next = pmVar1;
  }
  return (realm._4_4_ + local_20 + -1) / local_20;
}

Assistant:

static int average_spell_stat(struct player *p, struct player_state *state)
{
	int i, count, sum = 0;
	struct magic_realm *realm = class_magic_realms(p->class, &count), *r_next;

	for (i = count; i > 0; i--) {
		sum += state->stat_ind[realm->stat];
		r_next = realm->next;
		mem_free(realm);
		realm = r_next;
	}
	return (sum + count - 1) / count;
}